

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *kernel0;
  float *img;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int iVar3;
  int in_stack_fffffffffffffec4;
  float *local_120;
  float *local_118;
  float *local_110;
  Mat local_100;
  float *local_c0;
  float *local_a8;
  int local_a0;
  float local_9c;
  Mat local_98;
  int local_54;
  float *local_50;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RDI + 0x34);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_40 = local_2c * 2 + local_34 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffeb8 = 0.0;
    }
    else {
      in_stack_fffffffffffffeb8 = local_50[local_54];
    }
    local_9c = in_stack_fffffffffffffeb8;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffebc);
    for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffeb0 = Mat::operator_cast_to_float_(&local_98);
      local_a8 = in_stack_fffffffffffffeb0;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      pfVar1 = Mat::operator_cast_to_float_(&local_100);
      Mat::~Mat((Mat *)0x1514a9);
      pfVar2 = local_48 + (long)(local_54 * local_30 * 9) + (long)(local_a0 * 9);
      local_118 = pfVar1 + local_2c;
      local_120 = pfVar1 + (local_2c << 1);
      local_110 = pfVar1;
      for (in_stack_fffffffffffffec4 = 0; iVar3 = local_34, in_stack_fffffffffffffec4 < local_38;
          in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
        for (; 0 < iVar3; iVar3 = iVar3 + -1) {
          in_stack_fffffffffffffebc =
               local_120[2] * pfVar2[8] +
               local_120[1] * pfVar2[7] +
               *local_120 * pfVar2[6] +
               local_118[2] * pfVar2[5] +
               local_118[1] * pfVar2[4] +
               *local_118 * pfVar2[3] +
               local_110[2] * pfVar2[2] + local_110[1] * pfVar2[1] + *local_110 * *pfVar2 + 0.0;
          *local_a8 = in_stack_fffffffffffffebc + *local_a8;
          local_110 = local_110 + 2;
          local_118 = local_118 + 2;
          local_120 = local_120 + 2;
          local_a8 = local_a8 + 1;
        }
        local_110 = local_110 + local_40;
        local_118 = local_118 + local_40;
        local_120 = local_120 + local_40;
        in_stack_fffffffffffffec0 = iVar3;
      }
      local_c0 = pfVar1;
    }
    Mat::~Mat((Mat *)0x1517c1);
  }
  return;
}

Assistant:

static void conv3x3s2_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q = 0; q < inch; q++)
        {
            float *outptr = out;

            const float *img = bottom_blob.channel(q);
            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float *r0 = img;
            const float *r1 = img + w;
            const float *r2 = img + w * 2;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }
        }
    }
}